

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O1

uint64_t anon_unknown.dwarf_63d4a7::round_down(uint64_t x,uint64_t b)

{
  int line;
  char *str;
  
  if ((int)POPCOUNT(b) == 1) {
    if ((-b & x) % b == 0) {
      return -b & x;
    }
    line = 0x22;
    str = "r <= x && r % b == 0";
  }
  else {
    line = 0x20;
    str = "pstore::is_power_of_two (b)";
  }
  pstore::assert_failed
            (str,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
             ,line);
}

Assistant:

constexpr std::uint64_t round_down (std::uint64_t const x, std::uint64_t const b) noexcept {
        PSTORE_ASSERT (pstore::is_power_of_two (b));
        std::uint64_t const r = x & ~(b - 1U);
        PSTORE_ASSERT (r <= x && r % b == 0);
        return r;
    }